

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastMtR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  TcParseTableBase **ppTVar1;
  ParseContext *pPVar2;
  ZeroCopyInputStream *pZVar3;
  MessageLite *pMVar4;
  uint64_t uVar5;
  ParseContext *pPVar6;
  byte bVar7;
  bool bVar8;
  unsigned_short uVar9;
  uint16_t uVar10;
  uint32_t uVar11;
  int v1;
  int v2;
  uint uVar12;
  char *pcVar13;
  FieldAux *pFVar14;
  TcParseTableBase *pTVar15;
  LogMessage *pLVar16;
  uint *puVar17;
  ulong uVar18;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_318;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_310;
  TcParseTableBase ***local_308;
  anon_class_24_3_e92acbd4 inner_loop;
  MessageLite *submsg;
  TcParseTableBase *inner_table;
  RepeatedPtrFieldBase *field;
  FieldAux aux;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_2c8;
  unsigned_short expected_tag;
  uint64_t local_2c0;
  TcParseTableBase *local_2b8;
  ParseContext *local_2b0;
  ZeroCopyInputStream *local_2a8;
  MessageLite *local_2a0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_298;
  TcFieldData local_290;
  TcFieldData local_288;
  undefined1 local_279;
  uint64_t uStack_278;
  bool always_return;
  TcParseTableBase *local_270;
  ParseContext *local_268;
  ZeroCopyInputStream *local_260;
  MessageLite *local_258;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_250;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_248;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_240;
  TcFieldData data_2;
  FastFieldEntry *fast_entry_1;
  size_t idx_1;
  unsigned_short coded_tag_1;
  uint32_t has_bits_offset_1;
  uint32_t has_bits_offset;
  LimitToken local_14c;
  undefined1 local_148 [16];
  LogMessageFatal local_138 [23];
  Voidify local_121;
  string *local_120;
  string *absl_log_internal_check_op_result;
  undefined4 local_110;
  int old_depth;
  LimitToken local_fc;
  TcParseTableBase ****ppppTStack_f8;
  LimitToken old;
  ZeroCopyInputStream *local_e0;
  undefined1 local_c8 [12];
  int size;
  ZeroCopyInputStream *local_b8;
  ParseContext *local_b0;
  ZeroCopyInputStream *local_a8;
  ZeroCopyInputStream *local_a0;
  TcParseTableBase ****local_98;
  TcFieldData local_90;
  TcParseTableBase **local_88;
  ParseContext *local_80;
  ZeroCopyInputStream *local_78;
  MessageLite *local_70;
  ZeroCopyInputStream *local_68;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_60;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_58;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  
  local_2c0 = hasbits;
  local_2b8 = table;
  local_2b0 = ctx;
  local_2a8 = (ZeroCopyInputStream *)ptr;
  local_2a0 = msg;
  local_298 = data.field_0;
  uVar9 = TcFieldData::coded_tag<unsigned_short>((TcFieldData *)&local_298);
  pMVar4 = local_2a0;
  pZVar3 = local_2a8;
  pPVar2 = local_2b0;
  if (uVar9 != 0) {
    TcFieldData::TcFieldData((TcFieldData *)&stack0xfffffffffffffd38);
    pcVar13 = MiniParse(pMVar4,(char *)pZVar3,pPVar2,(TcFieldData)aStack_2c8,local_2b8,local_2c0);
    return pcVar13;
  }
  aux.map_info.node_size_info._2_2_ = UnalignedLoad<unsigned_short>((char *)local_2a8);
  pTVar15 = local_2b8;
  bVar7 = TcFieldData::aux_idx((TcFieldData *)&local_298);
  pFVar14 = TcParseTableBase::field_aux(pTVar15,(uint)bVar7);
  pMVar4 = local_2a0;
  field = (RepeatedPtrFieldBase *)pFVar14->table;
  uVar10 = TcFieldData::offset((TcFieldData *)&local_298);
  inner_table = (TcParseTableBase *)
                RefAt<google::protobuf::internal::RepeatedPtrFieldBase>(pMVar4,(ulong)uVar10);
  submsg = (MessageLite *)field;
  do {
    local_2a8 = (ZeroCopyInputStream *)((long)&local_2a8->_vptr_ZeroCopyInputStream + 2);
    inner_loop.inner_table =
         (TcParseTableBase **)
         AddMessage((TcParseTableBase *)submsg,(RepeatedPtrFieldBase *)inner_table);
    pZVar3 = local_2a8;
    pPVar2 = local_2b0;
    local_308 = &inner_loop.inner_table;
    inner_loop.submsg = (MessageLite **)&local_2b0;
    inner_loop.ctx = (ParseContext **)&submsg;
    ppppTStack_f8 = &local_308;
    EpsCopyInputStream::LimitToken::LimitToken(&local_fc);
    local_b0 = pPVar2;
    local_b8 = pZVar3;
    unique0x1000068e = &local_fc;
    local_c8._4_4_ = ReadSize((char **)&local_b8);
    if ((local_b8 == (ZeroCopyInputStream *)0x0) || (pPVar2->depth_ < 1)) {
      local_a8 = (ZeroCopyInputStream *)0x0;
    }
    else {
      EpsCopyInputStream::PushLimit((EpsCopyInputStream *)local_c8,(char *)pPVar2,(int)local_b8);
      EpsCopyInputStream::LimitToken::operator=(stack0xffffffffffffff40,(LimitToken *)local_c8);
      EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)local_c8);
      pPVar2->depth_ = pPVar2->depth_ + -1;
      local_a8 = local_b8;
    }
    if (local_a8 == (ZeroCopyInputStream *)0x0) {
      local_e0 = local_a8;
    }
    else {
      absl_log_internal_check_op_result._4_4_ = pPVar2->depth_;
      local_98 = ppppTStack_f8;
      local_a0 = local_a8;
      local_70 = (MessageLite *)**ppppTStack_f8;
      local_80 = (ParseContext *)*ppppTStack_f8[1];
      local_78 = local_a8;
      local_88 = *ppppTStack_f8[2] + 7;
      while (bVar8 = ParseContext::Done(local_80,(char **)&local_78), pMVar4 = local_70,
            pZVar3 = local_78, pPVar6 = local_80, ((bVar8 ^ 0xffU) & 1) != 0) {
        TcFieldData::TcFieldData(&local_90);
        ppTVar1 = local_88;
        pTVar15 = (TcParseTableBase *)(local_88 + -7);
        uVar9 = UnalignedLoad<unsigned_short>((char *)pZVar3);
        if (((long)(int)((uint)uVar9 & (uint)*(byte *)(ppTVar1 + -6)) & 7U) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x44d);
        }
        data_1.field_0 =
             (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             TcParseTableBase::fast_entry
                       (pTVar15,(ulong)(long)(int)((uint)uVar9 & (uint)*(byte *)(ppTVar1 + -6)) >> 3
                       );
        local_58.data =
             ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
             (ulong)uVar9;
        UNRECOVERED_JUMPTABLE =
             TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
        local_60.data = local_58.data;
        local_78 = (ZeroCopyInputStream *)
                   (*UNRECOVERED_JUMPTABLE)
                             (pMVar4,(char *)pZVar3,pPVar6,(TcFieldData)local_58,pTVar15,0);
        if ((local_78 == (ZeroCopyInputStream *)0x0) ||
           (uVar11 = EpsCopyInputStream::LastTag(&local_80->super_EpsCopyInputStream), uVar11 != 1))
        break;
      }
      if (((ulong)*local_88 & 0x100) == 0) {
        local_68 = local_78;
        local_88 = local_88 + -7;
      }
      else {
        ppTVar1 = local_88 + -2;
        local_88 = local_88 + -7;
        local_68 = (ZeroCopyInputStream *)(*(code *)*ppTVar1)(local_70,local_78,local_80);
      }
      local_e0 = local_68;
      if (local_68 != (ZeroCopyInputStream *)0x0) {
        v1 = absl::lts_20240722::log_internal::GetReferenceableValue
                       (absl_log_internal_check_op_result._4_4_);
        v2 = absl::lts_20240722::log_internal::GetReferenceableValue(pPVar2->depth_);
        local_120 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                              (v1,v2,"old_depth == depth_");
        if (local_120 != (string *)0x0) {
          local_148 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_120);
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_138,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                     ,1099,local_148._0_8_,local_148._8_8_);
          pLVar16 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                              ((LogMessage *)local_138);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_121,pLVar16);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_138);
        }
        local_120 = (string *)0x0;
      }
      pPVar2->depth_ = pPVar2->depth_ + 1;
      EpsCopyInputStream::LimitToken::LimitToken(&local_14c,&local_fc);
      bVar8 = EpsCopyInputStream::PopLimit(&pPVar2->super_EpsCopyInputStream,&local_14c);
      EpsCopyInputStream::LimitToken::~LimitToken(&local_14c);
      if (((bVar8 ^ 0xffU) & 1) == 0) {
      }
      else {
        local_e0 = (ZeroCopyInputStream *)0x0;
      }
    }
    local_110 = 1;
    EpsCopyInputStream::LimitToken::~LimitToken(&local_fc);
    pMVar4 = local_2a0;
    pPVar2 = local_2b0;
    local_2a8 = local_e0;
    if (local_e0 == (ZeroCopyInputStream *)0x0) {
      TcFieldData::TcFieldData((TcFieldData *)&local_310);
      pcVar13 = Error(pMVar4,(char *)0x0,pPVar2,(TcFieldData)local_310,local_2b8,local_2c0);
      return pcVar13;
    }
    bVar8 = EpsCopyInputStream::DataAvailable(&local_2b0->super_EpsCopyInputStream,(char *)local_e0)
    ;
    pMVar4 = local_2a0;
    pZVar3 = local_2a8;
    if (((bVar8 ^ 0xffU) & 1) != 0) {
      TcFieldData::TcFieldData(&local_318);
      if (local_2b8->has_bits_offset != 0) {
        uVar12 = (uint)local_2c0;
        puVar17 = RefAt<unsigned_int>(pMVar4,(ulong)(uint)local_2b8->has_bits_offset);
        *puVar17 = uVar12 | *puVar17;
      }
      return (char *)pZVar3;
    }
    uVar9 = UnalignedLoad<unsigned_short>((char *)local_2a8);
    local_258 = local_2a0;
    local_260 = local_2a8;
    local_268 = local_2b0;
    if (uVar9 != aux.map_info.node_size_info._2_2_) {
      TcFieldData::TcFieldData(&data_local);
      local_250 = data_local.field_0;
      local_270 = local_2b8;
      uStack_278 = local_2c0;
      local_279 = 0;
      bVar8 = EpsCopyInputStream::DataAvailable
                        (&local_268->super_EpsCopyInputStream,(char *)local_260);
      pMVar4 = local_258;
      pZVar3 = local_260;
      pPVar2 = local_268;
      if (!bVar8) {
        TcFieldData::TcFieldData(&local_288);
        if (local_270->has_bits_offset != 0) {
          uVar12 = (uint)uStack_278;
          puVar17 = RefAt<unsigned_int>(pMVar4,(ulong)(uint)local_270->has_bits_offset);
          *puVar17 = uVar12 | *puVar17;
        }
        return (char *)pZVar3;
      }
      TcFieldData::TcFieldData(&local_290);
      pTVar15 = local_270;
      uVar5 = uStack_278;
      uVar9 = UnalignedLoad<unsigned_short>((char *)pZVar3);
      uVar18 = (ulong)(int)((uint)uVar9 & (uint)pTVar15->fast_idx_mask);
      if ((uVar18 & 7) == 0) {
        data_2.field_0 =
             (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             TcParseTableBase::fast_entry(pTVar15,uVar18 >> 3);
        local_240.data =
             ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_2.field_0 + 8))->data ^
             (ulong)uVar9;
        UNRECOVERED_JUMPTABLE =
             TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_2.field_0);
        local_248.data = local_240.data;
        pcVar13 = (*UNRECOVERED_JUMPTABLE)
                            (pMVar4,(char *)pZVar3,pPVar2,(TcFieldData)local_240,pTVar15,uVar5);
        return pcVar13;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMtR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint16_t, false, true>(
      PROTOBUF_TC_PARAM_PASS);
}